

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  bool bVar5;
  imapstate iVar6;
  _Bool *p_Var7;
  connectdata *conn_00;
  _Bool _Var8;
  char cVar9;
  CURLcode CVar10;
  int iVar11;
  curl_off_t cVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  _Bool *p_Var16;
  Curl_easy *data;
  long lVar17;
  char *pcVar18;
  char *value;
  char *name;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  pcVar14 = (pCVar2->state).up.path;
  lVar17 = 1;
  pcVar18 = pcVar14;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar15 = pcVar18;
    pcVar18 = pcVar15 + 1;
    _Var8 = imap_is_bchar(pcVar15[1]);
    lVar17 = lVar17 + -1;
  } while (_Var8);
  if (lVar17 == 0) {
    *(undefined8 *)((long)pvVar3 + 8) = 0;
  }
  else {
    pcVar14 = pcVar14 + 1;
    if (*pcVar15 != '/') {
      pcVar15 = pcVar18;
    }
    CVar10 = Curl_urldecode(pCVar2,pcVar14,(long)pcVar15 - (long)pcVar14,(char **)((long)pvVar3 + 8)
                            ,(size_t *)0x0,true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
  }
  while( true ) {
    conn_00 = local_38;
    cVar9 = *pcVar18;
    if (cVar9 != ';') break;
    pcVar14 = pcVar18 + 1;
    pcVar15 = pcVar18 + 2;
    sVar13 = 0;
    pcVar18 = pcVar14;
    while( true ) {
      if (pcVar15[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar15[-1] == '=') break;
      pcVar15 = pcVar15 + 1;
      sVar13 = sVar13 + 1;
      pcVar18 = pcVar18 + 1;
    }
    CVar10 = Curl_urldecode(pCVar2,pcVar14,sVar13,&name,(size_t *)0x0,true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    sVar13 = 0xffffffffffffffff;
    do {
      pcVar14 = pcVar18 + 1;
      pcVar18 = pcVar18 + 1;
      _Var8 = imap_is_bchar(*pcVar14);
      sVar13 = sVar13 + 1;
    } while (_Var8);
    CVar10 = Curl_urldecode(pCVar2,pcVar15,sVar13,&value,&local_48,true);
    if (CVar10 != CURLE_OK) {
      (*Curl_cfree)(name);
      return CVar10;
    }
    iVar11 = Curl_strcasecompare(name,"UIDVALIDITY");
    if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x10) != 0)) {
      iVar11 = Curl_strcasecompare(name,"UID");
      if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x18) != 0)) {
        iVar11 = Curl_strcasecompare(name,"MAILINDEX");
        if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x20) != 0)) {
          iVar11 = Curl_strcasecompare(name,"SECTION");
          if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x28) != 0)) {
            iVar11 = Curl_strcasecompare(name,"PARTIAL");
            if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x30) != 0)) {
              (*Curl_cfree)(name);
              (*Curl_cfree)(value);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
              value[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar3 + 0x30) = value;
          }
          else {
            if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
              value[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar3 + 0x28) = value;
          }
        }
        else {
          if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
            value[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x20) = value;
        }
      }
      else {
        if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
          value[local_48 - 1] = '\0';
        }
        *(char **)((long)pvVar3 + 0x18) = value;
      }
    }
    else {
      if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
        value[local_48 - 1] = '\0';
      }
      *(char **)((long)pvVar3 + 0x10) = value;
    }
    value = (char *)0x0;
    (*Curl_cfree)(name);
    (*Curl_cfree)(value);
  }
  if (((*(long *)((long)pvVar3 + 8) != 0) && (*(long *)((long)pvVar3 + 0x18) == 0)) &&
     (*(long *)((long)pvVar3 + 0x20) == 0)) {
    curl_url_get((pCVar2->state).uh,CURLUPART_QUERY,(char **)((long)pvVar3 + 0x38),0x40);
    cVar9 = *pcVar18;
  }
  if (cVar9 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar2 = conn_00->data;
  pcVar14 = (pCVar2->set).str[6];
  if (pcVar14 != (char *)0x0) {
    pvVar3 = (pCVar2->req).protop;
    CVar10 = Curl_urldecode(pCVar2,pcVar14,0,(char **)((long)pvVar3 + 0x40),(size_t *)0x0,true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    pcVar14 = *(char **)((long)pvVar3 + 0x40);
    pcVar18 = pcVar14;
    for (; *pcVar14 != '\0'; pcVar14 = pcVar14 + 1) {
      if (*pcVar14 == ' ') {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        *(char **)((long)pvVar3 + 0x48) = pcVar14;
        *pcVar18 = '\0';
        if (*(long *)((long)pvVar3 + 0x48) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar18 = pcVar18 + 1;
    }
  }
  pCVar2 = conn_00->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn_00->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if ((pCVar2->set).opt_no_body == true) {
    *puVar4 = 1;
  }
  *local_40 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar14 = (conn_00->proto).imapc.mailbox, pcVar14 == (char *)0x0)) ||
      (iVar11 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar14), iVar11 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar14 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar14 != (char *)0x0)) &&
      (iVar11 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar14), iVar11 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  data = conn_00->data;
  if (((data->set).upload != false) || ((pCVar2->set).mimepost.kind != MIMEKIND_NONE)) {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar14 = "Cannot APPEND without a mailbox.";
      goto LAB_001301d0;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      cVar12 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar10 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      pcVar14 = Curl_checkheaders(conn_00,"Mime-Version");
      if ((pcVar14 == (char *)0x0) &&
         (CVar10 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar10 != CURLE_OK)) {
        return CVar10;
      }
      CVar10 = Curl_mime_rewind(part);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      cVar12 = Curl_mime_size(part);
      (data->state).infilesize = cVar12;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if (cVar12 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar14 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar14 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar10 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar14,(data->state).infilesize);
    (*Curl_cfree)(pcVar14);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    iVar6 = IMAP_APPEND;
LAB_00130352:
    (conn_00->proto).imapc.state = iVar6;
    goto LAB_0013038f;
  }
  if (*(long *)(puVar4 + 0x10) == 0) {
    if (!bVar5) {
      if (*(long *)(puVar4 + 2) != 0) {
        if ((*(long *)(puVar4 + 6) == 0) && (*(long *)(puVar4 + 8) == 0)) {
          lVar17 = *(long *)(puVar4 + 0xe);
          goto joined_r0x001302d2;
        }
        goto LAB_001302d8;
      }
      goto LAB_0013037d;
    }
    if ((*(long *)(puVar4 + 6) == 0) && (*(long *)(puVar4 + 8) == 0)) {
      if (*(long *)(puVar4 + 0xe) == 0) goto LAB_0013037d;
      CVar10 = imap_perform_search(conn_00);
    }
    else {
      CVar10 = imap_perform_fetch(conn_00);
    }
  }
  else {
    if (!bVar5) {
      lVar17 = *(long *)(puVar4 + 2);
joined_r0x001302d2:
      if (lVar17 != 0) {
LAB_001302d8:
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox);
        (conn_00->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox_uidvalidity);
        (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar14 = *(char **)((long)pvVar3 + 8);
        if (pcVar14 == (char *)0x0) {
          data = conn_00->data;
          pcVar14 = "Cannot SELECT without a mailbox.";
LAB_001301d0:
          Curl_failf(data,pcVar14);
          return CURLE_URL_MALFORMAT;
        }
        pcVar14 = imap_atom(pcVar14,false);
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar10 = imap_sendf(conn_00,"SELECT %s",pcVar14);
        (*Curl_cfree)(pcVar14);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        iVar6 = IMAP_SELECT;
        goto LAB_00130352;
      }
    }
LAB_0013037d:
    CVar10 = imap_perform_list(conn_00);
  }
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
LAB_0013038f:
  p_Var7 = local_40;
  p_Var16 = local_40;
  CVar10 = imap_multi_statemach(conn_00,local_40);
  if ((CVar10 == CURLE_OK) && (CVar10 = CURLE_OK, *p_Var7 == true)) {
    imap_dophase_done(conn_00,SUB81(p_Var16,0));
  }
  return CVar10;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}